

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

Array<double,_3,_3,_0,_3,_3> * __thiscall
Eigen::PlainObjectBase<Eigen::Array<double,3,3,0,3,3>>::
_set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Array<double,3,3,0,3,3>>const,Eigen::Replicate<Eigen::Array<double,3,1,0,3,1>,1,3>const>>
          (PlainObjectBase<Eigen::Array<double,3,3,0,3,3>> *this,
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Array<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Replicate<Eigen::Array<double,_3,_1,_0,_3,_1>,_1,_3>_>_>
          *other)

{
  ActualDstType actualDst;
  assign_op<double,_double> local_9;
  
  internal::
  Assignment<Eigen::Array<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Array<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Replicate<Eigen::Array<double,_3,_1,_0,_3,_1>,_1,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Array<double,_3,_3,_0,_3,_3> *)this,
        (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Array<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Replicate<Eigen::Array<double,_3,_1,_0,_3,_1>,_1,_3>_>
         *)other,&local_9);
  return (Array<double,_3,_3,_0,_3,_3> *)this;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }